

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.cpp
# Opt level: O1

ClusterGraph * __thiscall
libDAI::ClusterGraph::VarElim
          (ClusterGraph *__return_storage_ptr__,ClusterGraph *this,
          vector<libDAI::Var,_std::allocator<libDAI::Var>_> *ElimSeq)

{
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  _Var1;
  pointer n;
  ClusterGraph Cl;
  VarSet local_d8;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet> local_b8;
  
  BipartiteGraph<libDAI::Var,_libDAI::VarSet>::BipartiteGraph
            (&local_b8,&this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>);
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  eraseNonMaximal((ClusterGraph *)&local_b8);
  n = (ElimSeq->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if (n != (ElimSeq->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    do {
      _Var1 = std::
              __find_if<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_equals_val<libDAI::Var_const>>
                        (local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                         _M_impl.super__Vector_impl_data._M_finish,n);
      Delta(&local_d8,(ClusterGraph *)&local_b8,
            (long)_Var1._M_current -
            (long)local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                  .super__Vector_impl_data._M_start >> 4);
      insert(__return_storage_ptr__,&local_d8);
      if (local_d8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      delta(&local_d8,(ClusterGraph *)&local_b8,n);
      insert((ClusterGraph *)&local_b8,&local_d8);
      if (local_d8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      _Var1 = std::
              __find_if<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_equals_val<libDAI::Var_const>>
                        (local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                         _M_impl.super__Vector_impl_data._M_finish,n);
      eraseSubsuming((ClusterGraph *)&local_b8,
                     (long)_Var1._M_current -
                     (long)local_b8._V1.
                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                           super__Vector_impl_data._M_start >> 4);
      eraseNonMaximal((ClusterGraph *)&local_b8);
      n = n + 1;
    } while (n != (ElimSeq->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
                  super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_b8._nb2);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_b8._nb1);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_b8._E12ind);
  if (local_b8._E12.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8._E12.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8._E12.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8._E12.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&local_b8._V2);
  if (local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ClusterGraph ClusterGraph::VarElim( const std::vector<Var> & ElimSeq ) const {
        // Make a copy
        ClusterGraph Cl(*this);

        ClusterGraph result;
        Cl.eraseNonMaximal();
        
        // Do variable elimination
        for( vector<Var>::const_iterator n = ElimSeq.begin(); n != ElimSeq.end(); n++ ) {
            assert( Cl.vars() && *n );

            result.insert( Cl.Delta(*n) );

            Cl.insert( Cl.delta(*n) );
            Cl.eraseSubsuming( *n );
            Cl.eraseNonMaximal();
        }

        return result;
    }